

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

optional<unsigned_int> __thiscall
slang::ast::ConditionalExpression::getEffectiveWidthImpl(ConditionalExpression *this)

{
  Expression *this_00;
  optional<unsigned_int> oVar1;
  _Optional_base<unsigned_int,_true,_true> _Var2;
  Expression *this_01;
  bool bVar3;
  
  if (this->isConst == false) {
    this_01 = this->left_;
  }
  else {
    this_01 = this->left_;
    this_00 = this_01;
    if (this->isTrue == false) {
      this_00 = this->right_;
    }
    if (this_00 != (Expression *)0x0) {
      oVar1 = Expression::getEffectiveWidth(this_00);
      return (optional<unsigned_int>)
             oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
    }
  }
  _Var2._M_payload.super__Optional_payload_base<unsigned_int> =
       (_Optional_payload<unsigned_int,_true,_true,_true>)Expression::getEffectiveWidth(this_01);
  oVar1 = Expression::getEffectiveWidth(this->right_);
  if ((oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._4_4_ &
       _Var2._M_payload.super__Optional_payload_base<unsigned_int>._4_4_ & 1) == 1) {
    bVar3 = _Var2._M_payload.super__Optional_payload_base<unsigned_int>._M_payload <
            oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload;
  }
  else {
    bVar3 = ((ulong)_Var2._M_payload.super__Optional_payload_base<unsigned_int> & 0x100000000) == 0
            && ((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int> & 0x100000000) != 0;
  }
  if (bVar3) {
    _Var2._M_payload.super__Optional_payload_base<unsigned_int> =
         (_Optional_payload<unsigned_int,_true,_true,_true>)
         (_Optional_payload<unsigned_int,_true,_true,_true>)oVar1;
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)
         _Var2._M_payload.super__Optional_payload_base<unsigned_int>;
}

Assistant:

std::optional<bitwidth_t> ConditionalExpression::getEffectiveWidthImpl() const {
    if (auto branch = knownSide())
        return branch->getEffectiveWidth();
    return std::max(left().getEffectiveWidth(), right().getEffectiveWidth());
}